

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O2

bool __thiscall slang::driver::Driver::reportDiagnostics(Driver *this,bool quiet)

{
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__source;
  byte bVar1;
  int iVar2;
  int iVar3;
  JsonWriter *this_00;
  string_view text;
  string_view text_00;
  string_view text_01;
  size_type sVar4;
  __optional_eq_t<std::__cxx11::basic_string<char>,_char[2]> _Var5;
  char *in_RCX;
  char *pcVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view sVar7;
  string_view text_02;
  format_args args;
  string_view contents;
  string_view fmt;
  size_t sStackY_90;
  string diagStr;
  undefined1 local_68 [12];
  color_union local_5c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  int local_48;
  char *local_38;
  
  iVar2 = (this->diagEngine).numErrors;
  this_00 = (this->jsonWriter)._M_t.
            super___uniq_ptr_impl<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_>._M_t.
            super__Tuple_impl<0UL,_slang::JsonWriter_*,_std::default_delete<slang::JsonWriter>_>.
            super__Head_base<0UL,_slang::JsonWriter_*,_false>._M_head_impl;
  if (this_00 != (JsonWriter *)0x0) {
    JsonWriter::endArray(this_00);
  }
  __source = &(this->options).diagJson;
  _Var5 = std::operator==(__source,(char (*) [2])0x4441bc);
  if (_Var5) {
    JsonWriter::view((this->jsonWriter)._M_t.
                     super___uniq_ptr_impl<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_slang::JsonWriter_*,_std::default_delete<slang::JsonWriter>_>
                     .super__Head_base<0UL,_slang::JsonWriter_*,_false>._M_head_impl);
    text._M_str = (char *)diagStr._M_string_length;
    text._M_len = (size_t)diagStr._M_dataplus._M_p;
    OS::print(text);
    if (quiet) goto LAB_0017cad4;
LAB_0017c9e9:
    text_00._M_str = (char *)diagStr._M_string_length;
    text_00._M_len = (size_t)diagStr._M_dataplus._M_p;
    OS::print(text_00);
  }
  else {
    TextDiagnosticClient::getString_abi_cxx11_
              (&diagStr,(this->textDiagClient).
                        super___shared_ptr<slang::TextDiagnosticClient,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
    sVar4 = diagStr._M_string_length;
    sVar7._M_str = (char *)diagStr._M_string_length;
    sVar7._M_len = (size_t)diagStr._M_dataplus._M_p;
    OS::printE(sVar7);
    if ((this->jsonWriter)._M_t.
        super___uniq_ptr_impl<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_>._M_t.
        super__Tuple_impl<0UL,_slang::JsonWriter_*,_std::default_delete<slang::JsonWriter>_>.
        super__Head_base<0UL,_slang::JsonWriter_*,_false>._M_head_impl != (JsonWriter *)0x0) {
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                ((path *)local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__source,
                 auto_format);
      sVar7 = JsonWriter::view((this->jsonWriter)._M_t.
                               super___uniq_ptr_impl<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_slang::JsonWriter_*,_std::default_delete<slang::JsonWriter>_>
                               .super__Head_base<0UL,_slang::JsonWriter_*,_false>._M_head_impl);
      contents._M_len = sVar7._M_str;
      contents._M_str = in_RCX;
      OS::writeFile((OS *)local_68,(path *)sVar7._M_len,contents);
      std::filesystem::__cxx11::path::~path((path *)local_68);
    }
    std::__cxx11::string::~string((string *)&diagStr);
    if (quiet) goto LAB_0017cad4;
    if (1 < sVar4) goto LAB_0017c9e9;
  }
  if (iVar2 == 0) {
    bVar1 = (((this->textDiagClient).
              super___shared_ptr<slang::TextDiagnosticClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_DiagnosticClient).field_0x1d;
    local_58._M_allocated_capacity = (ulong)(uint5)local_58._M_allocated_capacity._3_5_ << 0x18;
    pcVar6 = "Build succeeded: ";
    sStackY_90 = 0x11;
  }
  else {
    bVar1 = (((this->textDiagClient).
              super___shared_ptr<slang::TextDiagnosticClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_DiagnosticClient).field_0x1b;
    local_58._M_allocated_capacity = (ulong)(uint5)local_58._M_allocated_capacity._3_5_ << 0x18;
    pcVar6 = "Build failed: ";
    sStackY_90 = 0xe;
  }
  local_68._0_8_ = (ulong)bVar1 << 0x20;
  local_58._M_allocated_capacity._0_2_ = 1;
  local_5c.term_color = '\0';
  local_68[8] = false;
  text_02._M_str = pcVar6;
  text_02._M_len = sStackY_90;
  OS::print((text_style *)local_68,text_02);
  iVar3 = (this->diagEngine).numErrors;
  local_48 = (this->diagEngine).numWarnings;
  local_38 = "s";
  local_58._M_allocated_capacity = (size_type)"s";
  if (iVar3 == 1) {
    local_58._M_allocated_capacity = (size_type)"";
  }
  if (local_48 == 1) {
    local_38 = "";
  }
  local_68._0_4_ = iVar3;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_68;
  fmt.size_ = 0xc1c1;
  fmt.data_ = (char *)0x19;
  ::fmt::v11::vformat_abi_cxx11_(&diagStr,(v11 *)"{} error{}, {} warning{}\n",fmt,args);
  text_01._M_str = (char *)diagStr._M_string_length;
  text_01._M_len = (size_t)diagStr._M_dataplus._M_p;
  OS::print(text_01);
  std::__cxx11::string::~string((string *)&diagStr);
LAB_0017cad4:
  return iVar2 == 0;
}

Assistant:

bool Driver::reportDiagnostics(bool quiet) {
    bool hasDiagsStdout = false;
    bool succeeded = diagEngine.getNumErrors() == 0;

    if (jsonWriter)
        jsonWriter->endArray();

    if (options.diagJson == "-") {
        // If we're printing JSON diagnostics to stdout don't also
        // print the text diagnostics.
        hasDiagsStdout = true;
        OS::print(jsonWriter->view());
    }
    else {
        std::string diagStr = textDiagClient->getString();
        hasDiagsStdout = diagStr.size() > 1;
        OS::printE(diagStr);

        if (jsonWriter)
            OS::writeFile(*options.diagJson, jsonWriter->view());
    }

    if (!quiet) {
        if (hasDiagsStdout)
            OS::print("\n");

        if (succeeded)
            OS::print(fg(textDiagClient->highlightColor), "Build succeeded: ");
        else
            OS::print(fg(textDiagClient->errorColor), "Build failed: ");

        OS::print(fmt::format("{} error{}, {} warning{}\n", diagEngine.getNumErrors(),
                              diagEngine.getNumErrors() == 1 ? "" : "s",
                              diagEngine.getNumWarnings(),
                              diagEngine.getNumWarnings() == 1 ? "" : "s"));
    }

    return succeeded;
}